

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_basetableref.cpp
# Opt level: O2

vector<duckdb::LogicalType,_true> *
duckdb::ExchangeAllNullTypes
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,
          vector<duckdb::LogicalType,_true> *types)

{
  pointer pLVar1;
  bool bVar2;
  vector<duckdb::LogicalType,_true> *__range1;
  LogicalType *type;
  pointer type_00;
  LogicalType LStack_38;
  
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&__return_storage_ptr__->
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pLVar1 = (__return_storage_ptr__->
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (type_00 = (__return_storage_ptr__->
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start; type_00 != pLVar1; type_00 = type_00 + 1)
  {
    bVar2 = ExpressionBinder::ContainsNullType(type_00);
    if (bVar2) {
      ExpressionBinder::ExchangeNullType(&LStack_38,type_00);
      LogicalType::operator=(type_00,&LStack_38);
      LogicalType::~LogicalType(&LStack_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<LogicalType> ExchangeAllNullTypes(const vector<LogicalType> &types) {
	vector<LogicalType> result = types;
	for (auto &type : result) {
		if (ExpressionBinder::ContainsNullType(type)) {
			type = ExpressionBinder::ExchangeNullType(type);
		}
	}
	return result;
}